

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cpp
# Opt level: O3

void __thiscall buffer::trim_data(buffer *this)

{
  ulong uVar1;
  char *__dest;
  int iVar2;
  ulong uVar3;
  
  __dest = this->buffer_;
  uVar3 = (long)this->end_ - (long)this->begin_;
  iVar2 = (int)uVar3;
  if ((0 < iVar2) && (uVar1 = (long)this->begin_ - (long)__dest, 0 < (int)uVar1)) {
    memmove(__dest,__dest + (uVar1 & 0x7fffffff),uVar3 & 0x7fffffff);
    __dest = this->buffer_;
  }
  this->begin_ = __dest;
  this->end_ = __dest + iVar2;
  return;
}

Assistant:

void buffer::trim_data()
{
    int used = end_ - begin_;
    int bias = begin_ - buffer_;
    if (used > 0 && bias > 0)
    {
        memmove(buffer_, buffer_ + bias, used);
    }

    begin_ = buffer_;
    end_ = begin_ + used;
}